

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  uint uVar8;
  ushort *puVar9;
  long lVar10;
  byte *pbVar11;
  ushort *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ushort *puVar16;
  BYTE *pBVar17;
  int iVar18;
  BYTE *s;
  ushort *puVar19;
  ushort *puVar20;
  BYTE *d_1;
  BYTE *pBVar21;
  BYTE *d;
  ulong uVar22;
  BYTE *dstEnd;
  int local_60;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar18 = -1;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar18 = 0;
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(src + compressedSize);
      pBVar2 = (BYTE *)(dst + dstCapacity);
      puVar16 = (ushort *)src;
      dstEnd = (BYTE *)dst;
      if (dstCapacity < 0x40) goto LAB_00109d13;
LAB_00109881:
      puVar20 = (ushort *)((long)puVar16 + 1);
      bVar3 = (byte)*puVar16;
      uVar8 = (uint)bVar3;
      uVar15 = (ulong)(uint)(bVar3 >> 4);
      if (bVar3 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= puVar20) goto LAB_00109d3a;
        puVar12 = puVar16 + 1;
        uVar14 = 0;
        puVar16 = puVar16 + 8;
        do {
          puVar19 = puVar20;
          puVar9 = puVar16;
          puVar20 = (ushort *)((long)puVar19 + 1);
          uVar14 = uVar14 + *(byte *)((long)puVar9 + -0xf);
          puVar12 = (ushort *)((long)puVar12 + 1);
          puVar16 = (ushort *)((long)puVar9 + 1);
        } while (puVar9 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar9 + -0xf) == 0xff);
        uVar15 = (ulong)uVar14 + 0xf;
        pBVar21 = dstEnd + uVar15;
        if ((CARRY8((ulong)dstEnd,uVar15)) || ((ulong)-(long)puVar12 < uVar15)) {
          puVar20 = puVar9 + -7;
          goto LAB_00109d3a;
        }
        if (dst + (long)dstCapacity + -0x20 < pBVar21) goto LAB_00109b91;
        puVar16 = (ushort *)((ulong)uVar14 + (long)puVar9 + 1);
        if (puVar1 + -0x10 < puVar16) {
          puVar20 = puVar9 + -7;
          goto LAB_00109b91;
        }
        lVar10 = 0;
        do {
          uVar6 = *(undefined8 *)((byte *)((long)puVar20 + lVar10) + 8);
          pBVar17 = dstEnd + lVar10;
          *(undefined8 *)pBVar17 = *(undefined8 *)((long)puVar20 + lVar10);
          *(undefined8 *)(pBVar17 + 8) = uVar6;
          pbVar11 = (byte *)((long)puVar19 + lVar10 + 0x11);
          uVar6 = *(undefined8 *)(pbVar11 + 8);
          *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pbVar11;
          *(undefined8 *)(pBVar17 + 0x18) = uVar6;
          lVar10 = lVar10 + 0x20;
        } while (pBVar17 + 0x20 < pBVar21);
      }
      else {
        pBVar21 = dstEnd + uVar15;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar20) goto LAB_00109b91;
        uVar6 = *(undefined8 *)((long)puVar16 + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)puVar20;
        *(undefined8 *)(dstEnd + 8) = uVar6;
        puVar16 = (ushort *)(uVar15 + (long)puVar20);
      }
      uVar5 = *puVar16;
      uVar13 = (ulong)uVar5;
      puVar16 = puVar16 + 1;
      pBVar17 = pBVar21 + -uVar13;
      uVar22 = (ulong)(bVar3 & 0xf);
      if (uVar22 == 0xf) {
        puVar20 = puVar16;
        if (pBVar17 < dst) goto LAB_00109d3a;
        uVar8 = 0;
        puVar12 = puVar16;
        do {
          puVar16 = (ushort *)((long)puVar12 + 1);
          puVar20 = puVar16;
          if (puVar1 + -2 <= puVar16) goto LAB_00109d3a;
          uVar7 = *puVar12;
          uVar8 = uVar8 + (byte)uVar7;
          puVar12 = puVar16;
        } while ((byte)uVar7 == 0xff);
        uVar15 = (ulong)uVar8;
        if ((BYTE *)(-uVar15 - 0x10) < pBVar21) goto LAB_00109d3a;
        uVar22 = uVar15 + 0x13;
        if (pBVar2 + -0x40 <= pBVar21 + uVar15 + 0x13) goto LAB_00109c64;
      }
      else {
        dstEnd = pBVar21 + uVar22 + 4;
        uVar22 = uVar22 + 4;
        if (pBVar2 + -0x40 <= dstEnd) goto LAB_00109c64;
        if ((dst <= pBVar17) && (7 < uVar5)) {
          *(undefined8 *)pBVar21 = *(undefined8 *)pBVar17;
          *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar17 + 8);
          *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
          goto LAB_00109881;
        }
      }
      puVar20 = puVar16;
      if (pBVar17 < dst) goto LAB_00109d3a;
      dstEnd = pBVar21 + uVar22;
      if (uVar5 < 0x10) {
        LZ4_memcpy_using_offset(pBVar21,pBVar17,dstEnd,uVar13);
      }
      else {
        do {
          uVar6 = *(undefined8 *)(pBVar21 + -uVar13 + 8);
          *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar21 + -uVar13);
          *(undefined8 *)(pBVar21 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pBVar21 + -uVar13 + 0x10 + 8);
          *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar21 + -uVar13 + 0x10);
          *(undefined8 *)(pBVar21 + 0x18) = uVar6;
          pBVar21 = pBVar21 + 0x20;
        } while (pBVar21 < dstEnd);
      }
      goto LAB_00109881;
    }
  }
  return iVar18;
LAB_00109c64:
  puVar20 = puVar16;
  if (pBVar17 < dst) {
LAB_00109d3a:
    local_60 = (int)src;
    return ~(uint)puVar20 + local_60;
  }
  dstEnd = pBVar21 + uVar22;
  if (pBVar2 + -0xc < dstEnd) {
    uVar15 = (long)pBVar2 - (long)pBVar21;
    if (uVar22 < (ulong)((long)pBVar2 - (long)pBVar21)) {
      uVar15 = uVar22;
    }
    dstEnd = pBVar21 + uVar15;
    if (pBVar21 < pBVar17 + uVar15) {
      if (pBVar2 != pBVar21) {
        do {
          BVar4 = *pBVar17;
          pBVar17 = pBVar17 + 1;
          *pBVar21 = BVar4;
          pBVar21 = pBVar21 + 1;
        } while (pBVar21 < dstEnd);
      }
    }
    else {
      memcpy(pBVar21,pBVar17,uVar15);
    }
    pBVar17 = pBVar2;
    if (dstEnd == pBVar2) goto LAB_00109d61;
  }
  else {
    if ((uint)uVar13 < 8) {
      pBVar21[0] = '\0';
      pBVar21[1] = '\0';
      pBVar21[2] = '\0';
      pBVar21[3] = '\0';
      *pBVar21 = *pBVar17;
      pBVar21[1] = pBVar17[1];
      pBVar21[2] = pBVar17[2];
      pBVar21[3] = pBVar17[3];
      uVar15 = (ulong)((uint)uVar13 << 2);
      uVar13 = (ulong)*(uint *)((long)inc32table + uVar15);
      *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)(pBVar17 + uVar13);
      pBVar17 = pBVar17 + (uVar13 - (long)*(int *)((long)dec64table + uVar15));
    }
    else {
      *(undefined8 *)pBVar21 = *(undefined8 *)pBVar17;
      pBVar17 = pBVar17 + 8;
    }
    *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)pBVar17;
    if (0x10 < uVar22) {
      pBVar21 = pBVar21 + 0x10;
      do {
        pBVar17 = pBVar17 + 8;
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar17;
        pBVar21 = pBVar21 + 8;
      } while (pBVar21 < dstEnd);
    }
  }
LAB_00109d13:
  bVar3 = (byte)*puVar16;
  puVar20 = (ushort *)((long)puVar16 + 1);
  while( true ) {
    uVar8 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uVar15 = (ulong)(uint)(bVar3 >> 4);
    if ((src + (long)compressedSize + -0x10 <= puVar20) ||
       (dst + (long)dstCapacity + -0x20 < dstEnd)) goto LAB_00109b8d;
    uVar6 = *(undefined8 *)(puVar20 + 4);
    *(undefined8 *)dstEnd = *(undefined8 *)puVar20;
    *(undefined8 *)(dstEnd + 8) = uVar6;
    pBVar21 = dstEnd + uVar15;
    uVar22 = (ulong)(uVar8 & 0xf);
    puVar16 = (ushort *)((long)puVar20 + uVar15) + 1;
    uVar5 = *(ushort *)((long)puVar20 + uVar15);
    uVar13 = (ulong)uVar5;
    pBVar17 = pBVar21 + -uVar13;
    if ((((uVar8 & 0xf) == 0xf) || (uVar5 < 8)) || (pBVar17 < dst)) goto LAB_00109c20;
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar17;
    *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar17 + 8);
    *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
    dstEnd = pBVar21 + uVar22 + 4;
    bVar3 = *(byte *)((long)puVar20 + uVar15 + 2);
    puVar20 = (ushort *)((long)puVar20 + uVar15 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar20) goto LAB_00109d3a;
  pbVar11 = (byte *)((long)puVar20 + 1);
  uVar14 = 0;
  do {
    uVar5 = *puVar20;
    puVar20 = (ushort *)((long)puVar20 + 1);
    uVar14 = uVar14 + (byte)uVar5;
    pbVar11 = pbVar11 + 1;
  } while (puVar20 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar15 = (ulong)uVar14 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar15)) || ((ulong)-(long)pbVar11 < uVar15)) goto LAB_00109d3a;
LAB_00109b8d:
  pBVar21 = dstEnd + uVar15;
LAB_00109b91:
  puVar16 = (ushort *)((long)puVar20 + uVar15);
  if ((pBVar2 + -0xc < pBVar21) || (puVar1 + -4 < puVar16)) {
    if (puVar1 + -4 < puVar16 && puVar16 != puVar1) goto LAB_00109d3a;
    if (pBVar2 < pBVar21) {
      memmove(dstEnd,puVar20,(long)pBVar2 - (long)dstEnd);
      pBVar17 = pBVar2;
LAB_00109d61:
      return (int)pBVar17 - (int)dst;
    }
    memmove(dstEnd,puVar20,uVar15);
    pBVar17 = dstEnd + uVar15;
    if ((pBVar21 == pBVar2) || (pBVar21 = pBVar17, puVar16 == puVar1)) goto LAB_00109d61;
  }
  else {
    do {
      *(undefined8 *)dstEnd = *(undefined8 *)puVar20;
      dstEnd = dstEnd + 8;
      puVar20 = puVar20 + 4;
    } while (dstEnd < pBVar21);
  }
  uVar13 = (ulong)*puVar16;
  puVar16 = puVar16 + 1;
  pBVar17 = pBVar21 + -uVar13;
  uVar22 = (ulong)(uVar8 & 0xf);
LAB_00109c20:
  if ((int)uVar22 == 0xf) {
    uVar8 = 0;
    do {
      puVar20 = puVar16;
      puVar16 = (ushort *)((long)puVar20 + 1);
      if (puVar1 + -2 <= puVar16) goto LAB_00109d37;
      uVar8 = uVar8 + (byte)*puVar20;
    } while ((byte)*puVar20 == 0xff);
    uVar22 = (ulong)uVar8 + 0xf;
    if (CARRY8((ulong)pBVar21,uVar22)) {
LAB_00109d37:
      puVar20 = (ushort *)((long)puVar20 + 1);
      goto LAB_00109d3a;
    }
  }
  uVar22 = uVar22 + 4;
  goto LAB_00109c64;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}